

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_64x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  ushort uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  unkuint9 Var48;
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  unkuint9 Var54;
  undefined1 auVar55 [11];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  ulong uVar66;
  uint uVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar71;
  ushort uVar72;
  ushort uVar73;
  short sVar74;
  short sVar75;
  ushort uVar76;
  ushort uVar77;
  short sVar78;
  short sVar79;
  ushort uVar80;
  ushort uVar81;
  short sVar82;
  ushort uVar83;
  ushort uVar84;
  short sVar85;
  ushort uVar86;
  ushort uVar87;
  short sVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  short sVar96;
  ushort uVar97;
  short sVar98;
  ushort uVar99;
  short sVar100;
  ushort uVar101;
  short sVar102;
  short sVar103;
  short sVar105;
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  ushort uVar108;
  short sVar109;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  undefined1 auVar110 [16];
  short sVar118;
  undefined1 auVar111 [16];
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  ushort uVar135;
  ushort uVar136;
  
  auVar69 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar4 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar1._0_13_;
  auVar5[0xe] = auVar1[7];
  auVar10[0xc] = auVar1[6];
  auVar10._0_12_ = auVar1._0_12_;
  auVar10._13_2_ = auVar5._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar1._0_11_;
  auVar15._12_3_ = auVar10._12_3_;
  auVar20[10] = auVar1[5];
  auVar20._0_10_ = auVar1._0_10_;
  auVar20._11_4_ = auVar15._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar1._0_9_;
  auVar25._10_5_ = auVar20._10_5_;
  auVar30[8] = auVar1[4];
  auVar30._0_8_ = auVar1._0_8_;
  auVar30._9_6_ = auVar25._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar30._8_7_;
  Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),auVar1[3]);
  auVar56._9_6_ = 0;
  auVar56._0_9_ = Var42;
  auVar43._1_10_ = SUB1510(auVar56 << 0x30,5);
  auVar43[0] = auVar1[2];
  auVar57._11_4_ = 0;
  auVar57._0_11_ = auVar43;
  auVar36[2] = auVar1[1];
  auVar36._0_2_ = auVar1._0_2_;
  auVar36._3_12_ = SUB1512(auVar57 << 0x20,3);
  uVar95 = auVar1._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar2._0_13_;
  auVar6[0xe] = auVar2[7];
  auVar11[0xc] = auVar2[6];
  auVar11._0_12_ = auVar2._0_12_;
  auVar11._13_2_ = auVar6._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar2._0_11_;
  auVar16._12_3_ = auVar11._12_3_;
  auVar21[10] = auVar2[5];
  auVar21._0_10_ = auVar2._0_10_;
  auVar21._11_4_ = auVar16._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar2._0_9_;
  auVar26._10_5_ = auVar21._10_5_;
  auVar31[8] = auVar2[4];
  auVar31._0_8_ = auVar2._0_8_;
  auVar31._9_6_ = auVar26._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar31._8_7_;
  Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),auVar2[3]);
  auVar58._9_6_ = 0;
  auVar58._0_9_ = Var45;
  auVar46._1_10_ = SUB1510(auVar58 << 0x30,5);
  auVar46[0] = auVar2[2];
  auVar59._11_4_ = 0;
  auVar59._0_11_ = auVar46;
  auVar37[2] = auVar2[1];
  auVar37._0_2_ = auVar2._0_2_;
  auVar37._3_12_ = SUB1512(auVar59 << 0x20,3);
  uVar97 = auVar2._0_2_ & 0xff;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar3._0_13_;
  auVar7[0xe] = auVar3[7];
  auVar12[0xc] = auVar3[6];
  auVar12._0_12_ = auVar3._0_12_;
  auVar12._13_2_ = auVar7._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar3._0_11_;
  auVar17._12_3_ = auVar12._12_3_;
  auVar22[10] = auVar3[5];
  auVar22._0_10_ = auVar3._0_10_;
  auVar22._11_4_ = auVar17._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar3._0_9_;
  auVar27._10_5_ = auVar22._10_5_;
  auVar32[8] = auVar3[4];
  auVar32._0_8_ = auVar3._0_8_;
  auVar32._9_6_ = auVar27._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar32._8_7_;
  Var48 = CONCAT81(SUB158(auVar47 << 0x40,7),auVar3[3]);
  auVar60._9_6_ = 0;
  auVar60._0_9_ = Var48;
  auVar49._1_10_ = SUB1510(auVar60 << 0x30,5);
  auVar49[0] = auVar3[2];
  auVar61._11_4_ = 0;
  auVar61._0_11_ = auVar49;
  auVar38[2] = auVar3[1];
  auVar38._0_2_ = auVar3._0_2_;
  auVar38._3_12_ = SUB1512(auVar61 << 0x20,3);
  uVar99 = auVar3._0_2_ & 0xff;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar4._0_13_;
  auVar8[0xe] = auVar4[7];
  auVar13[0xc] = auVar4[6];
  auVar13._0_12_ = auVar4._0_12_;
  auVar13._13_2_ = auVar8._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar4._0_11_;
  auVar18._12_3_ = auVar13._12_3_;
  auVar23[10] = auVar4[5];
  auVar23._0_10_ = auVar4._0_10_;
  auVar23._11_4_ = auVar18._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar4._0_9_;
  auVar28._10_5_ = auVar23._10_5_;
  auVar33[8] = auVar4[4];
  auVar33._0_8_ = auVar4._0_8_;
  auVar33._9_6_ = auVar28._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar33._8_7_;
  Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),auVar4[3]);
  auVar62._9_6_ = 0;
  auVar62._0_9_ = Var51;
  auVar52._1_10_ = SUB1510(auVar62 << 0x30,5);
  auVar52[0] = auVar4[2];
  auVar63._11_4_ = 0;
  auVar63._0_11_ = auVar52;
  auVar39[2] = auVar4[1];
  auVar39._0_2_ = auVar4._0_2_;
  auVar39._3_12_ = SUB1512(auVar63 << 0x20,3);
  uVar101 = auVar4._0_2_ & 0xff;
  uVar66 = 0;
  do {
    auVar104 = *(undefined1 (*) [16])(smooth_weights + uVar66 + 0x3c);
    auVar9[0xd] = 0;
    auVar9._0_13_ = auVar104._0_13_;
    auVar9[0xe] = auVar104[7];
    auVar14[0xc] = auVar104[6];
    auVar14._0_12_ = auVar104._0_12_;
    auVar14._13_2_ = auVar9._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar104._0_11_;
    auVar19._12_3_ = auVar14._12_3_;
    auVar24[10] = auVar104[5];
    auVar24._0_10_ = auVar104._0_10_;
    auVar24._11_4_ = auVar19._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar104._0_9_;
    auVar29._10_5_ = auVar24._10_5_;
    auVar34[8] = auVar104[4];
    auVar34._0_8_ = auVar104._0_8_;
    auVar34._9_6_ = auVar29._9_6_;
    auVar53._7_8_ = 0;
    auVar53._0_7_ = auVar34._8_7_;
    Var54 = CONCAT81(SUB158(auVar53 << 0x40,7),auVar104[3]);
    auVar64._9_6_ = 0;
    auVar64._0_9_ = Var54;
    auVar55._1_10_ = SUB1510(auVar64 << 0x30,5);
    auVar55[0] = auVar104[2];
    auVar65._11_4_ = 0;
    auVar65._0_11_ = auVar55;
    auVar40[2] = auVar104[1];
    auVar40._0_2_ = auVar104._0_2_;
    auVar40._3_12_ = SUB1512(auVar65 << 0x20,3);
    auVar106._0_2_ = auVar104._0_2_ & 0xff;
    auVar106._2_13_ = auVar40._2_13_;
    auVar106[0xf] = 0;
    auVar70._0_2_ = CONCAT11(0,auVar104[8]);
    auVar70[2] = auVar104[9];
    auVar70[3] = 0;
    auVar70[4] = auVar104[10];
    auVar70[5] = 0;
    auVar70[6] = auVar104[0xb];
    auVar70[7] = 0;
    auVar70[8] = auVar104[0xc];
    auVar70[9] = 0;
    auVar70[10] = auVar104[0xd];
    auVar70[0xb] = 0;
    auVar70[0xc] = auVar104[0xe];
    auVar70[0xd] = 0;
    auVar70[0xe] = auVar104[0xf];
    auVar70[0xf] = 0;
    sVar74 = auVar69._0_2_;
    auVar111._0_2_ = (0x100 - auVar106._0_2_) * sVar74;
    sVar78 = auVar69._2_2_;
    auVar111._2_2_ = (0x100 - auVar40._2_2_) * sVar78;
    auVar111._4_2_ = (0x100 - auVar55._0_2_) * sVar74;
    auVar111._6_2_ = (0x100 - (short)Var54) * sVar78;
    auVar111._8_2_ = (0x100 - auVar34._8_2_) * sVar74;
    auVar111._10_2_ = (0x100 - auVar24._10_2_) * sVar78;
    auVar111._12_2_ = (0x100 - auVar14._12_2_) * sVar74;
    auVar111._14_2_ = (0x100 - (auVar9._13_2_ >> 8)) * sVar78;
    uVar67 = 0xfefdfefe;
    do {
      uVar67 = uVar67 + 0x2020202;
      auVar110._4_4_ = uVar67;
      auVar110._0_4_ = uVar67;
      auVar110._8_4_ = uVar67;
      auVar110._12_4_ = uVar67;
      auVar107 = pshufb(auVar106,auVar110);
      auVar110 = pshufb(auVar111,auVar110);
      sVar71 = auVar107._0_2_;
      sVar75 = auVar107._2_2_;
      sVar79 = auVar107._4_2_;
      sVar82 = auVar107._6_2_;
      sVar96 = (short)Var42;
      sVar85 = auVar107._8_2_;
      sVar88 = auVar107._10_2_;
      sVar103 = auVar107._12_2_;
      sVar105 = auVar107._14_2_;
      uVar35 = auVar5._13_2_ >> 8;
      sVar109 = auVar110._0_2_ + 0x80;
      sVar112 = auVar110._2_2_ + 0x80;
      sVar113 = auVar110._4_2_ + 0x80;
      sVar114 = auVar110._6_2_ + 0x80;
      sVar115 = auVar110._8_2_ + 0x80;
      sVar116 = auVar110._10_2_ + 0x80;
      sVar117 = auVar110._12_2_ + 0x80;
      sVar118 = auVar110._14_2_ + 0x80;
      uVar72 = sVar71 * uVar95 + sVar109;
      uVar76 = sVar75 * auVar36._2_2_ + sVar112;
      uVar80 = sVar79 * auVar43._0_2_ + sVar113;
      uVar83 = sVar82 * sVar96 + sVar114;
      uVar86 = sVar85 * auVar30._8_2_ + sVar115;
      uVar89 = sVar88 * auVar20._10_2_ + sVar116;
      uVar91 = sVar103 * auVar10._12_2_ + sVar117;
      uVar93 = sVar105 * uVar35 + sVar118;
      uVar73 = uVar72 >> 8;
      uVar77 = uVar76 >> 8;
      uVar81 = uVar80 >> 8;
      uVar84 = uVar83 >> 8;
      uVar87 = uVar86 >> 8;
      uVar90 = uVar89 >> 8;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar119 = sVar71 * (ushort)auVar1[8] + sVar109;
      uVar121 = sVar75 * (ushort)auVar1[9] + sVar112;
      uVar123 = sVar79 * (ushort)auVar1[10] + sVar113;
      uVar125 = sVar82 * (ushort)auVar1[0xb] + sVar114;
      uVar127 = sVar85 * (ushort)auVar1[0xc] + sVar115;
      uVar129 = sVar88 * (ushort)auVar1[0xd] + sVar116;
      uVar131 = sVar103 * (ushort)auVar1[0xe] + sVar117;
      uVar133 = sVar105 * (ushort)auVar1[0xf] + sVar118;
      uVar120 = uVar119 >> 8;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar134 = uVar133 >> 8;
      *dst = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
      dst[1] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[2] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
      dst[3] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
      dst[4] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
      dst[5] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
      dst[6] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[7] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[8] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
      dst[9] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[10] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0xb] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0xc] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0xd] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0xe] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0xf] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
      sVar98 = (short)Var45;
      uVar72 = auVar6._13_2_ >> 8;
      uVar73 = sVar71 * uVar97 + sVar109;
      uVar77 = sVar75 * auVar37._2_2_ + sVar112;
      uVar81 = sVar79 * auVar46._0_2_ + sVar113;
      uVar84 = sVar82 * sVar98 + sVar114;
      uVar87 = sVar85 * auVar31._8_2_ + sVar115;
      uVar90 = sVar88 * auVar21._10_2_ + sVar116;
      uVar92 = sVar103 * auVar11._12_2_ + sVar117;
      uVar94 = sVar105 * uVar72 + sVar118;
      uVar76 = uVar73 >> 8;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar120 = sVar71 * (ushort)auVar2[8] + sVar109;
      uVar122 = sVar75 * (ushort)auVar2[9] + sVar112;
      uVar124 = sVar79 * (ushort)auVar2[10] + sVar113;
      uVar126 = sVar82 * (ushort)auVar2[0xb] + sVar114;
      uVar128 = sVar85 * (ushort)auVar2[0xc] + sVar115;
      uVar130 = sVar88 * (ushort)auVar2[0xd] + sVar116;
      uVar132 = sVar103 * (ushort)auVar2[0xe] + sVar117;
      uVar134 = sVar105 * (ushort)auVar2[0xf] + sVar118;
      uVar121 = uVar120 >> 8;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      dst[0x10] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar76);
      dst[0x11] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[0x12] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[0x13] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[0x14] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[0x15] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[0x16] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[0x17] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[0x18] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x19] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x1a] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x1b] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x1c] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x1d] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0x1e] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0x1f] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      sVar100 = (short)Var48;
      uVar73 = auVar7._13_2_ >> 8;
      uVar76 = sVar71 * uVar99 + sVar109;
      uVar80 = sVar75 * auVar38._2_2_ + sVar112;
      uVar83 = sVar79 * auVar49._0_2_ + sVar113;
      uVar86 = sVar82 * sVar100 + sVar114;
      uVar89 = sVar85 * auVar32._8_2_ + sVar115;
      uVar91 = sVar88 * auVar22._10_2_ + sVar116;
      uVar93 = sVar103 * auVar12._12_2_ + sVar117;
      uVar119 = sVar105 * uVar73 + sVar118;
      uVar77 = uVar76 >> 8;
      uVar81 = uVar80 >> 8;
      uVar84 = uVar83 >> 8;
      uVar87 = uVar86 >> 8;
      uVar90 = uVar89 >> 8;
      uVar92 = uVar91 >> 8;
      uVar94 = uVar93 >> 8;
      uVar120 = uVar119 >> 8;
      uVar121 = sVar71 * (ushort)auVar3[8] + sVar109;
      uVar123 = sVar75 * (ushort)auVar3[9] + sVar112;
      uVar125 = sVar79 * (ushort)auVar3[10] + sVar113;
      uVar127 = sVar82 * (ushort)auVar3[0xb] + sVar114;
      uVar129 = sVar85 * (ushort)auVar3[0xc] + sVar115;
      uVar131 = sVar88 * (ushort)auVar3[0xd] + sVar116;
      uVar133 = sVar103 * (ushort)auVar3[0xe] + sVar117;
      uVar135 = sVar105 * (ushort)auVar3[0xf] + sVar118;
      uVar122 = uVar121 >> 8;
      uVar124 = uVar123 >> 8;
      uVar126 = uVar125 >> 8;
      uVar128 = uVar127 >> 8;
      uVar130 = uVar129 >> 8;
      uVar132 = uVar131 >> 8;
      uVar134 = uVar133 >> 8;
      uVar136 = uVar135 >> 8;
      dst[0x20] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
      dst[0x21] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
      dst[0x22] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
      dst[0x23] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
      dst[0x24] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
      dst[0x25] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
      dst[0x26] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
      dst[0x27] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
      dst[0x28] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
      dst[0x29] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
      dst[0x2a] = (uVar126 != 0) * (uVar126 < 0x100) * (char)(uVar125 >> 8) - (0xff < uVar126);
      dst[0x2b] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
      dst[0x2c] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
      dst[0x2d] = (uVar132 != 0) * (uVar132 < 0x100) * (char)(uVar131 >> 8) - (0xff < uVar132);
      dst[0x2e] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
      dst[0x2f] = (uVar136 != 0) * (uVar136 < 0x100) * (char)(uVar135 >> 8) - (0xff < uVar136);
      sVar102 = (short)Var51;
      uVar76 = auVar8._13_2_ >> 8;
      uVar77 = sVar71 * uVar101 + sVar109;
      uVar81 = sVar75 * auVar39._2_2_ + sVar112;
      uVar84 = sVar79 * auVar52._0_2_ + sVar113;
      uVar87 = sVar82 * sVar102 + sVar114;
      uVar90 = sVar85 * auVar33._8_2_ + sVar115;
      uVar92 = sVar88 * auVar23._10_2_ + sVar116;
      uVar94 = sVar103 * auVar13._12_2_ + sVar117;
      uVar120 = sVar105 * uVar76 + sVar118;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar121 = uVar120 >> 8;
      uVar122 = sVar71 * (ushort)auVar4[8] + sVar109;
      uVar124 = sVar75 * (ushort)auVar4[9] + sVar112;
      uVar126 = sVar79 * (ushort)auVar4[10] + sVar113;
      uVar128 = sVar82 * (ushort)auVar4[0xb] + sVar114;
      uVar130 = sVar85 * (ushort)auVar4[0xc] + sVar115;
      uVar132 = sVar88 * (ushort)auVar4[0xd] + sVar116;
      uVar134 = sVar103 * (ushort)auVar4[0xe] + sVar117;
      uVar136 = sVar105 * (ushort)auVar4[0xf] + sVar118;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      uVar108 = uVar136 >> 8;
      dst[0x30] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[0x31] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[0x32] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[0x33] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[0x34] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[0x35] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[0x36] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[0x37] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x38] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x39] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x3a] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x3b] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x3c] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0x3d] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0x3e] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      dst[0x3f] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar108);
      dst = dst + stride;
    } while (uVar67 < 0xd0c0d0d);
    auVar107._0_2_ = (0x100 - auVar70._0_2_) * sVar74;
    auVar107._2_2_ = (0x100 - (ushort)auVar104[9]) * sVar78;
    auVar107._4_2_ = (0x100 - (ushort)auVar104[10]) * sVar74;
    auVar107._6_2_ = (0x100 - (ushort)auVar104[0xb]) * sVar78;
    auVar107._8_2_ = (0x100 - (ushort)auVar104[0xc]) * sVar74;
    auVar107._10_2_ = (0x100 - (ushort)auVar104[0xd]) * sVar78;
    auVar107._12_2_ = (0x100 - (ushort)auVar104[0xe]) * sVar74;
    auVar107._14_2_ = (0x100 - (ushort)auVar104[0xf]) * sVar78;
    uVar67 = 0xfefdfefe;
    do {
      uVar67 = uVar67 + 0x2020202;
      auVar104._4_4_ = uVar67;
      auVar104._0_4_ = uVar67;
      auVar104._8_4_ = uVar67;
      auVar104._12_4_ = uVar67;
      auVar111 = pshufb(auVar70,auVar104);
      auVar104 = pshufb(auVar107,auVar104);
      sVar74 = auVar111._0_2_;
      sVar78 = auVar111._2_2_;
      sVar71 = auVar111._4_2_;
      sVar75 = auVar111._6_2_;
      sVar79 = auVar111._8_2_;
      sVar82 = auVar111._10_2_;
      sVar85 = auVar111._12_2_;
      sVar88 = auVar111._14_2_;
      sVar103 = auVar104._0_2_ + 0x80;
      sVar105 = auVar104._2_2_ + 0x80;
      sVar109 = auVar104._4_2_ + 0x80;
      sVar112 = auVar104._6_2_ + 0x80;
      sVar113 = auVar104._8_2_ + 0x80;
      sVar114 = auVar104._10_2_ + 0x80;
      sVar115 = auVar104._12_2_ + 0x80;
      sVar116 = auVar104._14_2_ + 0x80;
      uVar77 = sVar74 * uVar95 + sVar103;
      uVar81 = sVar78 * auVar36._2_2_ + sVar105;
      uVar84 = sVar71 * auVar43._0_2_ + sVar109;
      uVar87 = sVar75 * sVar96 + sVar112;
      uVar90 = sVar79 * auVar30._8_2_ + sVar113;
      uVar92 = sVar82 * auVar20._10_2_ + sVar114;
      uVar94 = sVar85 * auVar10._12_2_ + sVar115;
      uVar120 = sVar88 * uVar35 + sVar116;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar121 = uVar120 >> 8;
      uVar122 = sVar74 * (ushort)auVar1[8] + sVar103;
      uVar124 = sVar78 * (ushort)auVar1[9] + sVar105;
      uVar126 = sVar71 * (ushort)auVar1[10] + sVar109;
      uVar128 = sVar75 * (ushort)auVar1[0xb] + sVar112;
      uVar130 = sVar79 * (ushort)auVar1[0xc] + sVar113;
      uVar132 = sVar82 * (ushort)auVar1[0xd] + sVar114;
      uVar134 = sVar85 * (ushort)auVar1[0xe] + sVar115;
      uVar136 = sVar88 * (ushort)auVar1[0xf] + sVar116;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      uVar108 = uVar136 >> 8;
      *dst = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[1] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[3] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[4] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[5] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[6] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[7] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[8] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[9] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[10] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0xb] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0xc] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0xd] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0xe] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      dst[0xf] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar108);
      uVar77 = sVar74 * uVar97 + sVar103;
      uVar81 = sVar78 * auVar37._2_2_ + sVar105;
      uVar84 = sVar71 * auVar46._0_2_ + sVar109;
      uVar87 = sVar75 * sVar98 + sVar112;
      uVar90 = sVar79 * auVar31._8_2_ + sVar113;
      uVar92 = sVar82 * auVar21._10_2_ + sVar114;
      uVar94 = sVar85 * auVar11._12_2_ + sVar115;
      uVar120 = sVar88 * uVar72 + sVar116;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar121 = uVar120 >> 8;
      uVar122 = sVar74 * (ushort)auVar2[8] + sVar103;
      uVar124 = sVar78 * (ushort)auVar2[9] + sVar105;
      uVar126 = sVar71 * (ushort)auVar2[10] + sVar109;
      uVar128 = sVar75 * (ushort)auVar2[0xb] + sVar112;
      uVar130 = sVar79 * (ushort)auVar2[0xc] + sVar113;
      uVar132 = sVar82 * (ushort)auVar2[0xd] + sVar114;
      uVar134 = sVar85 * (ushort)auVar2[0xe] + sVar115;
      uVar136 = sVar88 * (ushort)auVar2[0xf] + sVar116;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      uVar108 = uVar136 >> 8;
      dst[0x10] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[0x11] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[0x12] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[0x13] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[0x14] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[0x15] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[0x16] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[0x17] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x18] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x19] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x1a] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x1b] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x1c] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0x1d] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0x1e] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      dst[0x1f] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar108);
      uVar77 = sVar74 * uVar99 + sVar103;
      uVar81 = sVar78 * auVar38._2_2_ + sVar105;
      uVar84 = sVar71 * auVar49._0_2_ + sVar109;
      uVar87 = sVar75 * sVar100 + sVar112;
      uVar90 = sVar79 * auVar32._8_2_ + sVar113;
      uVar92 = sVar82 * auVar22._10_2_ + sVar114;
      uVar94 = sVar85 * auVar12._12_2_ + sVar115;
      uVar120 = sVar88 * uVar73 + sVar116;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar121 = uVar120 >> 8;
      uVar122 = sVar74 * (ushort)auVar3[8] + sVar103;
      uVar124 = sVar78 * (ushort)auVar3[9] + sVar105;
      uVar126 = sVar71 * (ushort)auVar3[10] + sVar109;
      uVar128 = sVar75 * (ushort)auVar3[0xb] + sVar112;
      uVar130 = sVar79 * (ushort)auVar3[0xc] + sVar113;
      uVar132 = sVar82 * (ushort)auVar3[0xd] + sVar114;
      uVar134 = sVar85 * (ushort)auVar3[0xe] + sVar115;
      uVar136 = sVar88 * (ushort)auVar3[0xf] + sVar116;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      uVar108 = uVar136 >> 8;
      dst[0x20] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[0x21] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[0x22] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[0x23] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[0x24] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[0x25] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[0x26] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[0x27] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x28] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x29] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x2a] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x2b] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x2c] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0x2d] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0x2e] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      dst[0x2f] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar108);
      uVar77 = sVar74 * uVar101 + sVar103;
      uVar81 = sVar78 * auVar39._2_2_ + sVar105;
      uVar84 = sVar71 * auVar52._0_2_ + sVar109;
      uVar87 = sVar75 * sVar102 + sVar112;
      uVar90 = sVar79 * auVar33._8_2_ + sVar113;
      uVar92 = sVar82 * auVar23._10_2_ + sVar114;
      uVar94 = sVar85 * auVar13._12_2_ + sVar115;
      uVar120 = sVar88 * uVar76 + sVar116;
      uVar80 = uVar77 >> 8;
      uVar83 = uVar81 >> 8;
      uVar86 = uVar84 >> 8;
      uVar89 = uVar87 >> 8;
      uVar91 = uVar90 >> 8;
      uVar93 = uVar92 >> 8;
      uVar119 = uVar94 >> 8;
      uVar121 = uVar120 >> 8;
      uVar122 = sVar74 * (ushort)auVar4[8] + sVar103;
      uVar124 = sVar78 * (ushort)auVar4[9] + sVar105;
      uVar126 = sVar71 * (ushort)auVar4[10] + sVar109;
      uVar128 = sVar75 * (ushort)auVar4[0xb] + sVar112;
      uVar130 = sVar79 * (ushort)auVar4[0xc] + sVar113;
      uVar132 = sVar82 * (ushort)auVar4[0xd] + sVar114;
      uVar134 = sVar85 * (ushort)auVar4[0xe] + sVar115;
      uVar136 = sVar88 * (ushort)auVar4[0xf] + sVar116;
      uVar123 = uVar122 >> 8;
      uVar125 = uVar124 >> 8;
      uVar127 = uVar126 >> 8;
      uVar129 = uVar128 >> 8;
      uVar131 = uVar130 >> 8;
      uVar133 = uVar132 >> 8;
      uVar135 = uVar134 >> 8;
      uVar108 = uVar136 >> 8;
      dst[0x30] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar80);
      dst[0x31] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar83);
      dst[0x32] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar86);
      dst[0x33] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
      dst[0x34] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
      dst[0x35] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
      dst[0x36] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar119);
      dst[0x37] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
      dst[0x38] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
      dst[0x39] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
      dst[0x3a] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
      dst[0x3b] = (uVar129 != 0) * (uVar129 < 0x100) * (char)(uVar128 >> 8) - (0xff < uVar129);
      dst[0x3c] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
      dst[0x3d] = (uVar133 != 0) * (uVar133 < 0x100) * (char)(uVar132 >> 8) - (0xff < uVar133);
      dst[0x3e] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
      dst[0x3f] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar108);
      dst = dst + stride;
    } while (uVar67 < 0xd0c0d0d);
    bVar68 = uVar66 < 0x30;
    uVar66 = uVar66 + 0x10;
  } while (bVar68);
  return;
}

Assistant:

void aom_smooth_v_predictor_64x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(128);
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}